

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArHosekSkyModel.c
# Opt level: O0

double art_blackbody_dd_value(double temperature,double lambda)

{
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double in_XMM1_Qa;
  double value;
  double c2;
  double c1;
  
  dVar1 = pow(in_XMM1_Qa,5.0);
  dVar2 = exp(0.0143878 / (in_XMM1_Qa * in_XMM0_Qa));
  return (3.74177e-16 / dVar1) * (1.0 / (dVar2 - 1.0));
}

Assistant:

double art_blackbody_dd_value(
        const double  temperature,
        const double  lambda
        )
{
    double  c1 = 3.74177 * 10E-17;
    double  c2 = 0.0143878;
    double  value;
    
    value =   ( c1 / ( pow( lambda, 5.0 ) ) )
            * ( 1.0 / ( exp( c2 / ( lambda * temperature ) ) - 1.0 ) );

    return value;
}